

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface6.c
# Opt level: O0

int run_test_udp_multicast_interface6(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 auVar3 [16];
  undefined1 local_198 [8];
  sockaddr_in6 baddr;
  sockaddr_in6 addr;
  uv_buf_t buf;
  uv_udp_send_t req;
  int r;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    req.bufsml[3].len._4_4_ = 1;
  }
  else {
    iVar1 = uv_ip6_addr("::1",0x23a3,(undefined1 *)((long)&baddr.sin6_addr.__in6_u + 0xc));
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x47,"0 == uv_ip6_addr(\"::1\", TEST_PORT, &addr)");
      abort();
    }
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,&server);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x4a,"r == 0");
      abort();
    }
    iVar1 = uv_ip6_addr("::",0,local_198);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x4c,"0 == uv_ip6_addr(\"::\", 0, &baddr)");
      abort();
    }
    iVar1 = uv_udp_bind(&server,local_198,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x4e,"r == 0");
      abort();
    }
    iVar1 = uv_udp_set_multicast_interface(&server,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x55,"r == 0");
      abort();
    }
    auVar3 = uv_buf_init("PING",4);
    buf.base = auVar3._8_8_;
    addr._20_8_ = auVar3._0_8_;
    iVar1 = uv_udp_send(&buf.len,&server,(undefined1 *)((long)&addr.sin6_addr.__in6_u + 0xc),1,
                        (undefined1 *)((long)&baddr.sin6_addr.__in6_u + 0xc),sv_send_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x5f,"r == 0");
      abort();
    }
    if (close_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x61,"close_cb_called == 0");
      abort();
    }
    if (sv_send_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x62,"sv_send_cb_called == 0");
      abort();
    }
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (sv_send_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x67,"sv_send_cb_called == 1");
      abort();
    }
    if (close_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x68,"close_cb_called == 1");
      abort();
    }
    loop = (uv_loop_t *)uv_default_loop();
    close_loop(loop);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-interface6.c"
              ,0x6a,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    uv_library_shutdown();
    req.bufsml[3].len._4_4_ = 0;
  }
  return req.bufsml[3].len._4_4_;
}

Assistant:

TEST_IMPL(udp_multicast_interface6) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in6 addr;
  struct sockaddr_in6 baddr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip6_addr("::", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT(r == 0);

#if defined(__APPLE__) || defined(__FreeBSD__) || defined(__FreeBSD_kernel__)
  r = uv_udp_set_multicast_interface(&server, "::1%lo0");
#else
  r = uv_udp_set_multicast_interface(&server, NULL);
#endif
  ASSERT(r == 0);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(sv_send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}